

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

int __thiscall
jsoncons::jsonpath::detail::
identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  wchar_t *pwVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  const_object_range_type *pcVar5;
  value_type *pvVar6;
  undefined7 extraout_var;
  size_t sVar7;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar8;
  long lVar10;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar11;
  wchar_t *pwVar12;
  int iVar13;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
  *this_00;
  supertype *psVar14;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *i;
  bool bVar15;
  const_object_iterator cVar16;
  type tVar17;
  string_view_type sVar18;
  uint in_stack_00000008;
  int64_t n;
  path_node_type *local_80;
  allocator<char> local_71;
  basic_path_node<wchar_t> *local_70;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_68;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_60;
  identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_58;
  undefined1 local_50 [16];
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_40;
  bool local_38;
  _func_int **pp_Var9;
  
  this_00 = (eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
             *)CONCAT44(in_register_00000034,__nfds);
  bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     __exceptfds);
  if (bVar3) {
    local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (this->identifier_)._M_string_length;
    local_58 = this;
    cVar16 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                       ((basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)
                        __exceptfds,(string_view_type *)local_50);
    local_68 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)cVar16.it_._M_current;
    pcVar5 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
             object_range_abi_cxx11_
                       ((const_object_range_type *)local_50,
                        (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)
                        __exceptfds);
    pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)CONCAT71((int7)((ulong)pcVar5 >> 8),local_38);
    if ((((undefined1  [16])cVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((local_38 & 1U) == 0)) {
      bVar3 = cVar16.has_value_ == local_38;
    }
    else {
      bVar3 = local_68 == local_40._M_current;
      pkVar11 = local_68;
    }
    pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)CONCAT71((int7)((ulong)pkVar11 >> 8),bVar3);
    if (bVar3 != false) goto LAB_0041c355;
    local_50._8_8_ = (local_58->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (local_58->identifier_)._M_string_length;
    if ((in_stack_00000008 & 0xb) != 0) {
      local_70 = (basic_path_node<wchar_t> *)__writefds;
      __writefds = (fd_set *)
                   eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<wchar_t>const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
                             (this_00,&local_70,
                              (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_50);
    }
    pvVar6 = &local_68->value_;
    psVar14 = (local_58->
              super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ).tail_;
    if (psVar14 == (supertype *)0x0) {
      lVar10 = __timeout->tv_sec;
LAB_0041c34c:
      pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(**(code **)(lVar10 + 0x10))(__timeout,__writefds,pvVar6);
      goto LAB_0041c355;
    }
    pp_Var9 = psVar14->_vptr_jsonpath_selector;
  }
  else {
    bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    if (bVar3) {
      local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)0x0;
      tVar17 = jsoncons::detail::dec_to_integer<long,wchar_t>
                         ((this->identifier_)._M_dataplus._M_p,(this->identifier_)._M_string_length,
                          (long *)&local_60);
      pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)tVar17.ptr;
      if (tVar17.ec == success) {
        i = local_60;
        if ((long)local_60 < 0) {
          sVar7 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             __exceptfds);
          i = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)((long)&(local_60->key_)._M_dataplus._M_p + sVar7);
        }
        pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                               ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
                                 *)__exceptfds);
        if (i < pkVar11) {
          local_80 = (path_node_type *)__writefds;
          local_50._0_8_ = i;
          if ((in_stack_00000008 & 0xb) != 0) {
            local_70 = (basic_path_node<wchar_t> *)__writefds;
            local_80 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                       ::
                       create_path_node<jsoncons::jsonpath::basic_path_node<wchar_t>const*,unsigned_long&>
                                 (this_00,&local_70,(unsigned_long *)local_50);
          }
          pbVar8 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                             ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *
                              )__exceptfds,(size_t)i);
          psVar14 = (this->
                    super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ).tail_;
          if (psVar14 == (supertype *)0x0) {
            pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)(**(code **)(__timeout->tv_sec + 0x10))(__timeout,local_80,pbVar8);
          }
          else {
            uVar4 = (*psVar14->_vptr_jsonpath_selector[2])
                              (psVar14,this_00,__readfds,local_80,pbVar8,__timeout,in_stack_00000008
                              );
            pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)(ulong)uVar4;
          }
        }
        goto LAB_0041c355;
      }
      sVar2 = (this->identifier_)._M_string_length;
      if (sVar2 != *(size_t *)(this_00 + 0x78)) goto LAB_0041c355;
      if (sVar2 != 0) {
        uVar4 = wmemcmp((this->identifier_)._M_dataplus._M_p,*(wchar_t **)(this_00 + 0x70),sVar2);
        pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)(ulong)uVar4;
        if (uVar4 != 0) goto LAB_0041c355;
      }
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)__exceptfds)
      ;
      local_50._0_8_ =
           basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                     ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                      __exceptfds);
      local_70 = (basic_path_node<wchar_t> *)((ulong)local_70 & 0xffffffffffffff00);
      pvVar6 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
               ::create_json<unsigned_long,jsoncons::semantic_tag,std::allocator<char>>
                         (this_00,(unsigned_long *)local_50,(semantic_tag *)&local_70,&local_71);
      local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
      local_50._0_8_ = (this->identifier_)._M_string_length;
      if ((in_stack_00000008 & 0xb) != 0) {
        local_70 = (basic_path_node<wchar_t> *)__writefds;
        __writefds = (fd_set *)
                     eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<wchar_t>const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
                               (this_00,&local_70,
                                (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_50);
      }
      psVar14 = (this->
                super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ).tail_;
      if (psVar14 == (supertype *)0x0) goto LAB_0041c345;
      pp_Var9 = psVar14->_vptr_jsonpath_selector;
    }
    else {
      bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)CONCAT71(extraout_var,bVar3);
      if ((!bVar3) ||
         (sVar2 = (this->identifier_)._M_string_length, sVar2 != *(size_t *)(this_00 + 0x78)))
      goto LAB_0041c355;
      if (sVar2 != 0) {
        uVar4 = wmemcmp((this->identifier_)._M_dataplus._M_p,*(wchar_t **)(this_00 + 0x70),sVar2);
        pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)(ulong)uVar4;
        if (uVar4 != 0) goto LAB_0041c355;
      }
      sVar18 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                         ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          __exceptfds);
      pwVar12 = sVar18._M_str;
      pwVar1 = pwVar12 + sVar18._M_len;
      iVar13 = 0;
      if ((long)sVar18._M_len < 1) {
        bVar3 = true;
        local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)0x0;
      }
      else {
        local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)0x0;
        do {
          bVar3 = (uint)*pwVar12 < 0x110000;
          if (!bVar3) {
            iVar13 = 6;
          }
          bVar15 = (*pwVar12 & 0xfffff800U) != 0xd800;
          if (!bVar15) {
            iVar13 = 4;
          }
          pwVar12 = pwVar12 + (bVar15 && bVar3);
        } while ((bVar15 && bVar3) &&
                (local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)((long)&(local_60->key_)._M_dataplus._M_p + 1), pwVar12 < pwVar1));
        bVar3 = iVar13 == 0;
      }
      if (pwVar12 != pwVar1) {
        local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)0x0;
      }
      if (!bVar3) {
        local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)0x0;
      }
      local_50._0_8_ = local_50._0_8_ & 0xffffffffffffff00;
      pvVar6 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
               ::create_json<unsigned_long&,jsoncons::semantic_tag,std::allocator<char>>
                         (this_00,(unsigned_long *)&local_60,local_50,(allocator<char> *)&local_70);
      local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
      local_50._0_8_ = (this->identifier_)._M_string_length;
      if ((in_stack_00000008 & 0xb) != 0) {
        local_70 = (basic_path_node<wchar_t> *)__writefds;
        __writefds = (fd_set *)
                     eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<wchar_t>const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
                               (this_00,&local_70,
                                (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_50);
      }
      psVar14 = (this->
                super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ).tail_;
      if (psVar14 == (supertype *)0x0) {
LAB_0041c345:
        lVar10 = __timeout->tv_sec;
        goto LAB_0041c34c;
      }
      pp_Var9 = psVar14->_vptr_jsonpath_selector;
    }
  }
  uVar4 = (*pp_Var9[2])(psVar14,this_00,__readfds,__writefds,pvVar6,__timeout,in_stack_00000008);
  pkVar11 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)(ulong)uVar4;
LAB_0041c355:
  return (int)pkVar11;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
            reference root,
            const path_node_type& last, 
            reference current,
            node_receiver_type& receiver,
            result_options options) const override
        {
            if (current.is_object())
            {
                auto it = current.find(identifier_);
                if (it != current.object_range().end())
                {
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, identifier_, options),
                                        (*it).value(), receiver, options);
                }
            }
            else if (current.is_array())
            {
                int64_t n{0};
                auto r = jsoncons::detail::dec_to_integer(identifier_.data(), identifier_.size(), n);
                if (r)
                {
                    auto index = (n >= 0) ? static_cast<std::size_t>(n) : static_cast<std::size_t>(static_cast<int64_t>(current.size()) + n);
                    if (index < current.size())
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, index, options),
                                            current[index], receiver, options);
                    }
                }
                else if (identifier_ == context.length_label() && current.size() >= 0)
                {
                    pointer ptr = context.create_json(current.size(), semantic_tag::none, context.get_allocator());
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, identifier_, options), 
                                        *ptr, 
                                        receiver, options);
                }
            }
            else if (current.is_string() && identifier_ == context.length_label())
            {
                string_view_type sv = current.as_string_view();
                std::size_t count = unicode_traits::count_codepoints(sv.data(), sv.size());
                pointer ptr = context.create_json(count, semantic_tag::none, context.get_allocator());
                this->tail_select(context, root, 
                                    path_generator_type::generate(context, last, identifier_, options), 
                                    *ptr, receiver, options);
            }
            //std::cout << "end identifier_selector\n";
        }